

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprAssignVarNumber(Parse *pParse,Expr *pExpr,u32 n)

{
  char *zName;
  uint uVar1;
  int iVar2;
  int *piVar3;
  sqlite3 *psVar4;
  int iVar5;
  int iVar6;
  ulong uVar8;
  short sVar9;
  undefined1 *puVar10;
  VList *pIn;
  long in_FS_OFFSET;
  bool bVar11;
  undefined1 *local_40;
  long local_38;
  u32 uVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pExpr == (Expr *)0x0) goto LAB_0016f11f;
  psVar4 = pParse->db;
  zName = (pExpr->u).zToken;
  if ((long)zName[1] == 0) {
    uVar1 = *(int *)&pParse->nVar + 1;
    puVar10 = (undefined1 *)(ulong)uVar1;
    pParse->nVar = (ynVar)uVar1;
  }
  else {
    if (*zName == '?') {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      if (n == 2) {
        bVar11 = false;
        puVar10 = (undefined1 *)((long)zName[1] + -0x30);
      }
      else {
        iVar5 = sqlite3Atoi64(zName + 1,(i64 *)&local_40,n - 1,'\x01');
        bVar11 = iVar5 != 0;
        puVar10 = local_40;
      }
      if (((bVar11) || ((long)puVar10 < 1)) || ((long)psVar4->aLimit[9] < (long)puVar10)) {
        sqlite3ErrorMsg(pParse,"variable number must be between ?1 and ?%d");
        psVar4 = pParse->db;
        do {
          uVar1 = pExpr->flags;
          if (((uVar1 & 3) == 0) && (iVar5 = (pExpr->w).iJoin, 0 < iVar5)) goto LAB_0016f116;
          pExpr = pExpr->pLeft;
        } while (pExpr != (Expr *)0x0);
        goto LAB_0016f11f;
      }
      sVar9 = (short)puVar10;
      if (pParse->nVar < sVar9) {
        pParse->nVar = sVar9;
        pIn = pParse->pVList;
      }
      else {
        pIn = pParse->pVList;
        if (pIn == (int *)0x0) {
          pIn = (int *)0x0;
        }
        else {
          iVar5 = 2;
          do {
            piVar3 = pIn + iVar5;
            if (*piVar3 == (int)sVar9) {
              if (piVar3 != (int *)0xfffffffffffffff8) goto LAB_0016f0d5;
              break;
            }
            iVar5 = iVar5 + piVar3[1];
          } while (iVar5 < pIn[1]);
        }
      }
    }
    else {
      pIn = pParse->pVList;
      uVar1 = sqlite3VListNameToNum(pIn,zName,n);
      puVar10 = (undefined1 *)(ulong)uVar1;
      if ((short)uVar1 != 0) goto LAB_0016f0d5;
      uVar1 = *(int *)&pParse->nVar + 1;
      puVar10 = (undefined1 *)(ulong)uVar1;
      pParse->nVar = (ynVar)uVar1;
    }
    uVar7 = n + 3;
    if (-1 < (int)n) {
      uVar7 = n;
    }
    iVar6 = (int)uVar7 >> 2;
    iVar5 = iVar6 + 3;
    if (pIn == (int *)0x0) {
      piVar3 = (int *)sqlite3DbMallocRawNN(psVar4,(long)iVar6 * 4 + 0x34);
      if (piVar3 != (int *)0x0) {
        uVar8 = (ulong)(iVar6 + 0xd);
        piVar3[1] = 2;
        iVar6 = 2;
LAB_0016f081:
        *piVar3 = (int)uVar8;
        iVar2 = iVar6 + iVar5;
        pIn = piVar3;
        goto LAB_0016f090;
      }
      pIn = (int *)0x0;
    }
    else {
      iVar6 = pIn[1];
      iVar2 = iVar6 + iVar5;
      if (*pIn < iVar2) {
        uVar8 = (long)iVar5 + (long)*pIn * 2;
        piVar3 = (int *)sqlite3DbRealloc(psVar4,pIn,uVar8 * 4);
        if (piVar3 != (int *)0x0) {
          iVar6 = piVar3[1];
          goto LAB_0016f081;
        }
      }
      else {
LAB_0016f090:
        piVar3 = pIn + iVar6;
        *piVar3 = (int)(short)puVar10;
        piVar3[1] = iVar5;
        pIn[1] = iVar2;
        memcpy(piVar3 + 2,zName,(long)(int)n);
        *(undefined1 *)((long)pIn + (long)(int)n + 8U + (long)iVar6 * 4) = 0;
      }
    }
    pParse->pVList = pIn;
  }
LAB_0016f0d5:
  pExpr->iColumn = (short)puVar10;
  if (psVar4->aLimit[9] < (int)(short)puVar10) {
    sqlite3ErrorMsg(pParse,"too many SQL variables");
    psVar4 = pParse->db;
    do {
      uVar1 = pExpr->flags;
      if (((uVar1 & 3) == 0) && (iVar5 = (pExpr->w).iJoin, 0 < iVar5)) goto LAB_0016f116;
      pExpr = pExpr->pLeft;
    } while (pExpr != (Expr *)0x0);
  }
LAB_0016f11f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
LAB_0016f116:
  if ((uVar1 >> 0x1e & 1) == 0) {
    psVar4->errByteOffset = iVar5;
  }
  goto LAB_0016f11f;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAssignVarNumber(Parse *pParse, Expr *pExpr, u32 n){
  sqlite3 *db = pParse->db;
  const char *z;
  ynVar x;

  if( pExpr==0 ) return;
  assert( !ExprHasProperty(pExpr, EP_IntValue|EP_Reduced|EP_TokenOnly) );
  z = pExpr->u.zToken;
  assert( z!=0 );
  assert( z[0]!=0 );
  assert( n==(u32)sqlite3Strlen30(z) );
  if( z[1]==0 ){
    /* Wildcard of the form "?".  Assign the next variable number */
    assert( z[0]=='?' );
    x = (ynVar)(++pParse->nVar);
  }else{
    int doAdd = 0;
    if( z[0]=='?' ){
      /* Wildcard of the form "?nnn".  Convert "nnn" to an integer and
      ** use it as the variable number */
      i64 i;
      int bOk;
      if( n==2 ){ /*OPTIMIZATION-IF-TRUE*/
        i = z[1]-'0';  /* The common case of ?N for a single digit N */
        bOk = 1;
      }else{
        bOk = 0==sqlite3Atoi64(&z[1], &i, n-1, SQLITE_UTF8);
      }
      testcase( i==0 );
      testcase( i==1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]-1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] );
      if( bOk==0 || i<1 || i>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
        sqlite3ErrorMsg(pParse, "variable number must be between ?1 and ?%d",
            db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]);
        sqlite3RecordErrorOffsetOfExpr(pParse->db, pExpr);
        return;
      }
      x = (ynVar)i;
      if( x>pParse->nVar ){
        pParse->nVar = (int)x;
        doAdd = 1;
      }else if( sqlite3VListNumToName(pParse->pVList, x)==0 ){
        doAdd = 1;
      }
    }else{
      /* Wildcards like ":aaa", "$aaa" or "@aaa".  Reuse the same variable
      ** number as the prior appearance of the same name, or if the name
      ** has never appeared before, reuse the same variable number
      */
      x = (ynVar)sqlite3VListNameToNum(pParse->pVList, z, n);
      if( x==0 ){
        x = (ynVar)(++pParse->nVar);
        doAdd = 1;
      }
    }
    if( doAdd ){
      pParse->pVList = sqlite3VListAdd(db, pParse->pVList, z, n, x);
    }
  }
  pExpr->iColumn = x;
  if( x>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
    sqlite3ErrorMsg(pParse, "too many SQL variables");
    sqlite3RecordErrorOffsetOfExpr(pParse->db, pExpr);
  }
}